

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O0

void __thiscall CLayerGroup::CLayerGroup(CLayerGroup *this)

{
  long in_RDI;
  
  array<CLayer_*,_allocator_default<CLayer_*>_>::array
            ((array<CLayer_*,_allocator_default<CLayer_*>_> *)0x1e9bd0);
  *(undefined1 *)(in_RDI + 0x3c) = 0;
  *(undefined1 *)(in_RDI + 0x49) = 1;
  *(undefined1 *)(in_RDI + 0x4a) = 1;
  *(undefined1 *)(in_RDI + 0x4b) = 0;
  *(undefined1 *)(in_RDI + 0x48) = 0;
  *(undefined4 *)(in_RDI + 0x18) = 0;
  *(undefined4 *)(in_RDI + 0x1c) = 0;
  *(undefined4 *)(in_RDI + 0x20) = 100;
  *(undefined4 *)(in_RDI + 0x24) = 100;
  *(undefined4 *)(in_RDI + 0x28) = 0;
  *(undefined4 *)(in_RDI + 0x2c) = 0;
  *(undefined4 *)(in_RDI + 0x30) = 0;
  *(undefined4 *)(in_RDI + 0x34) = 0;
  *(undefined4 *)(in_RDI + 0x38) = 0;
  return;
}

Assistant:

CLayerGroup::CLayerGroup()
{
	m_aName[0] = 0;
	m_Visible = true;
	m_SaveToMap = true;
	m_Collapse = false;
	m_GameGroup = false;
	m_OffsetX = 0;
	m_OffsetY = 0;
	m_ParallaxX = 100;
	m_ParallaxY = 100;

	m_UseClipping = 0;
	m_ClipX = 0;
	m_ClipY = 0;
	m_ClipW = 0;
	m_ClipH = 0;
}